

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2d2edf::check<unsigned_char>(istream *is,uchar c)

{
  undefined8 in_RAX;
  ostream *poVar1;
  uchar v;
  
  v = (uchar)((ulong)in_RAX >> 0x38);
  std::istream::read((char *)is,(long)&v);
  poVar1 = std::operator<<((ostream *)&std::cout,_typeinfo + (*_typeinfo == '*'));
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = std::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = std::operator<<(poVar1,v);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (v == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = unsigned char]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}